

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

void tty_cmd(void)

{
  char cVar1;
  ulong __request;
  
  cVar1 = (char)*(ushort *)DLTTYPortCmd;
  if (-1 < cVar1) {
    return;
  }
  switch(cVar1) {
  case -0x80:
    tty_put();
    break;
  case -0x7f:
    if ((*(ushort *)DLTTYPortCmd >> 0xd & 1) != 0) {
      tty_setbaudrate();
    }
    break;
  default:
    error("TTY: tty_cmd");
    break;
  case -0x7d:
    tty_open();
    break;
  case -0x7c:
    tty_close();
    break;
  case -0x7a:
    if (TTY_Fd < 0) break;
    __request = 0x5427;
    goto LAB_001357d3;
  case -0x79:
    if (TTY_Fd < 0) break;
    __request = 0x5428;
LAB_001357d3:
    ioctl(TTY_Fd,__request,0);
  }
  *(ushort *)DLTTYPortCmd = *(ushort *)DLTTYPortCmd & 0xff7f;
  return;
}

Assistant:

void tty_cmd(void)
{
  if (DLTTYPortCmd->command >= PUT_CHAR) {
    if (DLTTYPortCmd->command == PUT_CHAR)
      tty_put();
    else if (DLTTYPortCmd->command == SET_PARAM)
      tty_setparam();
    else if (DLTTYPortCmd->command == TTY_ON)
      tty_open();
    else if (DLTTYPortCmd->command == TTY_OFF)
      tty_close();
    else if (DLTTYPortCmd->command == TTY_BREAK_ON)
      tty_breakon();
    else if (DLTTYPortCmd->command == TTY_BREAK_OFF)
      tty_breakoff();
    else
      error("TTY: tty_cmd");

    DLTTYPortCmd->command &= ~PUT_CHAR;
  }
}